

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Value * google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MILSpec::Value>
                  (Arena *arena)

{
  Value *this;
  
  if (arena == (Arena *)0x0) {
    this = (Value *)operator_new(0x30);
    CoreML::Specification::MILSpec::Value::Value(this,(Arena *)0x0,false);
  }
  else {
    this = (Value *)AllocateAlignedWithHook
                              (arena,0x30,
                               (type_info *)&CoreML::Specification::MILSpec::Value::typeinfo);
    CoreML::Specification::MILSpec::Value::Value(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }